

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_msb.c
# Opt level: O0

void mgga_x_msb_init(xc_func_type *p)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  mgga_x_msb_params *params;
  
  pvVar2 = malloc(0x18);
  in_RDI[0x2f] = pvVar2;
  puVar1 = (undefined8 *)in_RDI[0x2f];
  if (*(int *)*in_RDI == 300) {
    *puVar1 = 0x3fe020c49ba5e354;
    puVar1[2] = 0x3ff8c00000000000;
    puVar1[1] = 0x3fc2b26bf8769ec3;
  }
  else {
    if (*(int *)*in_RDI != 0x12d) {
      fprintf(_stderr,"Internal error in mgga_x_msb\n");
      exit(1);
    }
    *puVar1 = 0x3fe40aa64c2f837b;
    puVar1[2] = 0x401134538ef34d6a;
    puVar1[1] = 0x3fbf67f4dbdf8f47;
  }
  return;
}

Assistant:

static void
mgga_x_msb_init(xc_func_type *p)
{
  mgga_x_msb_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(mgga_x_msb_params));
  params = (mgga_x_msb_params *)p->params;

  switch(p->info->number){
  case XC_MGGA_X_MS2B:
    params->kappa = 0.504;
    params->b     = (27.0*4.0 - 9.0)/64.0;
    params->c     = 0.14607;
    break;
  case XC_MGGA_X_MS2BS:
    params->kappa = 0.6263;
    params->b     = 4.3011;
    params->c     = 0.12268;
    break;
  default:
    fprintf(stderr, "Internal error in mgga_x_msb\n");
    exit(1);
  }
}